

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmem.c
# Opt level: O0

int psmem_mwr(nettlp *nt,tlp_mr_hdr *mh,void *m,size_t count,void *arg)

{
  tlp_mr_hdr buf;
  size_t in_RCX;
  void *in_RDX;
  tlp_mr_hdr *in_RSI;
  nettlp *in_RDI;
  tlp_mr_hdr *in_R8;
  uintptr_t addr;
  psmem *p;
  int in_stack_ffffffffffffffbc;
  int local_4;
  
  buf = (tlp_mr_hdr)tlp_mr_addr(in_R8);
  if (nostdout == 0) {
    fprintf(_stdout,"%s: MWr to 0x%lx, tag 0x%02x, %lu byte\n","psmem_mwr",buf,(ulong)in_RSI->tag,
            in_RCX);
  }
  if (((ulong)buf < (ulong)*in_R8) || ((ulong)((long)*in_R8 + (long)in_R8[1]) < (long)buf + in_RCX))
  {
    fprintf(_stderr,"%s:ERR: MWr request to 0x%lx, stick out of the pseudo memory region\n",
            "psmem_mwr",buf);
    send_cpl_abort(in_RDI,in_RSI);
    local_4 = -1;
  }
  else {
    if ((nohex == 0) && (nostdout == 0)) {
      hexdump((void *)buf,in_stack_ffffffffffffffbc);
    }
    memcpy((void *)((long)in_R8[2] + ((long)buf - (long)*in_R8)),in_RDX,in_RCX);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int psmem_mwr(struct nettlp *nt, struct tlp_mr_hdr *mh,
	     void *m, size_t count, void *arg)
{
	struct psmem *p = arg;
	uintptr_t addr;
	
	addr = tlp_mr_addr(mh);
	
	pr_info("MWr to 0x%lx, tag 0x%02x, %lu byte\n", addr, mh->tag, count);

	if (addr < p->addr || addr + count > p->addr + p->size) {
		pr_err("MWr request to 0x%lx, "
		       "stick out of the pseudo memory region\n", addr);
		send_cpl_abort(nt, mh);
		return -1;
	}

	if (!nohex && !nostdout)
		hexdump(m, count);

	memcpy(p->mem + (addr - p->addr), m, count);

	return 0;
}